

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O1

void __thiscall
woff2::anon_unknown_2::GlyfEncoder::WriteInstructions(GlyfEncoder *this,Glyph *glyph)

{
  uint8_t *__src;
  pointer puVar1;
  pointer puVar2;
  ulong __n;
  
  woff2::Write255UShort((vector *)&this->glyph_stream_,(uint)glyph->instructions_size);
  __n = (ulong)glyph->instructions_size;
  if (__n != 0) {
    __src = glyph->instructions_data;
    puVar1 = (this->instruction_stream_).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar2 = (this->instruction_stream_).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->instruction_stream_,(size_type)(puVar1 + (__n - (long)puVar2)));
    memcpy(puVar1 + ((long)(this->instruction_stream_).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start - (long)puVar2),__src,__n);
    return;
  }
  return;
}

Assistant:

void WriteInstructions(const Glyph& glyph) {
    Write255UShort(&glyph_stream_, glyph.instructions_size);
    WriteBytes(&instruction_stream_,
               glyph.instructions_data, glyph.instructions_size);
  }